

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Weave(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  bool bVar1;
  char *pcVar2;
  AActor *self;
  
  if (numparam < 1) {
    pcVar2 = "(paramnum) < numparam";
    goto LAB_003ea8d5;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003ea8d5;
        }
        goto LAB_003ea85a;
      }
    }
    else if (self != (AActor *)0x0) goto LAB_003ea8c5;
    self = (AActor *)0x0;
LAB_003ea85a:
    if (numparam == 1) {
      pcVar2 = "(paramnum) < numparam";
    }
    else {
      if (param[1].field_0.field_3.Type == '\0') {
        if ((uint)numparam < 3) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[2].field_0.field_3.Type == '\0') {
            if (numparam == 3) {
              pcVar2 = "(paramnum) < numparam";
            }
            else {
              if (param[3].field_0.field_3.Type == '\x01') {
                if ((uint)numparam < 5) {
                  pcVar2 = "(paramnum) < numparam";
                }
                else {
                  if (param[4].field_0.field_3.Type == '\x01') {
                    A_Weave(self,param[1].field_0.i,param[2].field_0.i,param[3].field_0.f,
                            param[4].field_0.f);
                    return 0;
                  }
                  pcVar2 = "param[paramnum].Type == REGT_FLOAT";
                }
                __assert_fail(pcVar2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x1489,
                              "int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              pcVar2 = "param[paramnum].Type == REGT_FLOAT";
            }
            __assert_fail(pcVar2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x1488,
                          "int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          pcVar2 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1487,
                      "int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
      }
      pcVar2 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1486,
                  "int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003ea8c5:
  pcVar2 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003ea8d5:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1485,"int AF_AActor_A_Weave(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Weave)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT	(xspeed);
	PARAM_INT	(yspeed);
	PARAM_FLOAT	(xdist);
	PARAM_FLOAT	(ydist);
	A_Weave(self, xspeed, yspeed, xdist, ydist);
	return 0;
}